

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cc
# Opt level: O3

void __thiscall wabt::Features::UpdateDependencies(Features *this)

{
  if (this->exceptions_enabled_ == true) {
    this->reference_types_enabled_ = true;
  }
  if (this->function_references_enabled_ == true) {
    this->reference_types_enabled_ = true;
  }
  if (this->bulk_memory_enabled_ == false) {
    this->reference_types_enabled_ = false;
  }
  return;
}

Assistant:

void Features::UpdateDependencies() {
  // Exception handling requires reference types.
  if (exceptions_enabled_) {
    reference_types_enabled_ = true;
  }

  // Function references require reference types.
  if (function_references_enabled_) {
    reference_types_enabled_ = true;
  }

  // Reference types requires bulk memory.
  if (!bulk_memory_enabled_) {
    reference_types_enabled_ = false;
  }
}